

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

uint32_t helper_bcdsub_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  int iVar1;
  uint32_t uVar2;
  undefined1 auStack_38 [4];
  int sgnb;
  ppc_avr_t bcopy;
  ppc_avr_t *ppStack_20;
  uint32_t ps_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  
  _auStack_38 = b->u64[0];
  bcopy.u64[0] = b->u64[1];
  bcopy.u32[3] = ps;
  ppStack_20 = b;
  b_local = a;
  a_local = r;
  iVar1 = bcd_get_sgn(b);
  if (iVar1 < 0) {
    bcd_put_digit((ppc_avr_t *)auStack_38,'\f',0);
  }
  else if (0 < iVar1) {
    bcd_put_digit((ppc_avr_t *)auStack_38,'\r',0);
  }
  uVar2 = helper_bcdadd_ppc(a_local,b_local,(ppc_avr_t *)auStack_38,bcopy.u32[3]);
  return uVar2;
}

Assistant:

uint32_t helper_bcdsub(ppc_avr_t *r,  ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    ppc_avr_t bcopy = *b;
    int sgnb = bcd_get_sgn(b);
    if (sgnb < 0) {
        bcd_put_digit(&bcopy, BCD_PLUS_PREF_1, 0);
    } else if (sgnb > 0) {
        bcd_put_digit(&bcopy, BCD_NEG_PREF, 0);
    }
    /* else invalid ... defer to bcdadd code for proper handling */

    return helper_bcdadd(r, a, &bcopy, ps);
}